

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPhase.hpp
# Opt level: O0

void __thiscall
qclab::qgates::CPhase<std::complex<double>_>::CPhase(CPhase<std::complex<double>_> *this)

{
  undefined4 local_14;
  CPhase<std::complex<double>_> *local_10;
  CPhase<std::complex<double>_> *this_local;
  
  local_10 = this;
  QControlledGate2<std::complex<double>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<double>_>,0,1);
  (this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_0075c610;
  local_14 = 1;
  std::make_unique<qclab::qgates::Phase<std::complex<double>>,int,double>
            ((int *)&this->gate_,(double *)&local_14);
  return;
}

Assistant:

CPhase()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< Phase< T > >( 1 , 0. ) )
        { }